

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void JitFFI::SysV64::CreateCaller(JitFuncCreater *jfc,ArgumentInfo *argumentinfo,void *func)

{
  ArgTypeInfo *ati;
  RetData *retdata;
  undefined1 local_78 [8];
  JitFuncCallerCreater jfcc;
  ArgOPList aol;
  void *func_local;
  ArgumentInfo *argumentinfo_local;
  JitFuncCreater *jfc_local;
  
  ati = get_argtypeinfo(argumentinfo);
  create_argoplist((ArgOPList *)&jfcc.addarg_double_count,ati);
  JitFuncCallerCreater::JitFuncCallerCreater((JitFuncCallerCreater *)local_78,jfc);
  create_function_caller_head((JitFuncCallerCreater *)local_78);
  OpCode_x64::mov(jfc,r12,rdi);
  OpCode_x64::mov(jfc,rbx,rsi);
  create_argument((JitFuncCallerCreater *)local_78,(ArgOPList *)&jfcc.addarg_double_count);
  JitFuncCallerCreater::call((JitFuncCallerCreater *)local_78,func);
  OpCode_x64::mov(jfc,rbx,r12);
  retdata = ArgOPList::get_retdata((ArgOPList *)&jfcc.addarg_double_count);
  create_return((JitFuncCallerCreater *)local_78,retdata);
  create_function_caller_foot((JitFuncCallerCreater *)local_78);
  ArgOPList::~ArgOPList((ArgOPList *)&jfcc.addarg_double_count);
  return;
}

Assistant:

void CreateCaller(JitFuncCreater &jfc, const ArgumentInfo &argumentinfo, void *func)
		{
			ArgOPList aol = create_argoplist(get_argtypeinfo(argumentinfo));


			JitFuncCallerCreater jfcc(jfc);
			create_function_caller_head(jfcc);

			mov(jfc, r12, rdi);
			mov(jfc, rbx, rsi);
			create_argument(jfcc, aol);

			jfcc.call(func);

			mov(jfc, rbx, r12);
			create_return(jfcc, aol.get_retdata());

			create_function_caller_foot(jfcc);

		}